

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O3

void testConversion(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  pointer pcVar3;
  char cVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  char *pcVar9;
  Compression *pCVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  int y;
  long lVar14;
  Compression comp;
  long lVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  OutputFile out;
  ulong auStack_110 [2];
  ulong *local_100;
  ulong *local_f8;
  undefined8 local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FrameBuffer fb;
  Header hdr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long lVar33;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing conversion between pixel data types",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"individual numbers",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  anon_unknown.dwarf_be6cc::testFloatToUint(0,0);
  anon_unknown.dwarf_be6cc::testFloatToUint(0x3f000000,0);
  anon_unknown.dwarf_be6cc::testFloatToUint(0xbf000000,0);
  anon_unknown.dwarf_be6cc::testFloatToUint(0x42f82000,0x7c);
  anon_unknown.dwarf_be6cc::testFloatToUint(0xc2f82000,0);
  anon_unknown.dwarf_be6cc::testFloatToUint(0x58635fa9,0xffffffff);
  anon_unknown.dwarf_be6cc::testFloatToUint(0xd8635fa9,0);
  anon_unknown.dwarf_be6cc::testFloatToUint(0x7f800000,0xffffffff);
  anon_unknown.dwarf_be6cc::testFloatToUint(0xff800000,0);
  anon_unknown.dwarf_be6cc::testFloatToUint(0x7fffffff,0);
  anon_unknown.dwarf_be6cc::testFloatToUint(0xffffffff,0);
  anon_unknown.dwarf_be6cc::testHalfToUint(0,0);
  anon_unknown.dwarf_be6cc::testHalfToUint(0x3800,0);
  anon_unknown.dwarf_be6cc::testHalfToUint(0xb800,0);
  anon_unknown.dwarf_be6cc::testHalfToUint(0x57c1,0x7c);
  anon_unknown.dwarf_be6cc::testHalfToUint(0xd7c1,0);
  anon_unknown.dwarf_be6cc::testHalfToUint(0x7c00,0xffffffff);
  anon_unknown.dwarf_be6cc::testHalfToUint(0xfc00,0);
  anon_unknown.dwarf_be6cc::testHalfToUint(0x7fff,0);
  anon_unknown.dwarf_be6cc::testHalfToUint(0xffff,0);
  anon_unknown.dwarf_be6cc::testFloatToHalf(0,0);
  anon_unknown.dwarf_be6cc::testFloatToHalf(0x3f000000,0x3800);
  anon_unknown.dwarf_be6cc::testFloatToHalf(0xbf000000,0xb800);
  anon_unknown.dwarf_be6cc::testFloatToHalf(0x42f82000,0x57c1);
  anon_unknown.dwarf_be6cc::testFloatToHalf(0xc2f82000,0xd7c1);
  anon_unknown.dwarf_be6cc::testFloatToHalf(0x58635fa9,0x7c00);
  anon_unknown.dwarf_be6cc::testFloatToHalf(0xd8635fa9,0xfc00);
  anon_unknown.dwarf_be6cc::testFloatToHalf(0x7f800000,0x7c00);
  anon_unknown.dwarf_be6cc::testFloatToHalf(0xff800000,0xfc00);
  anon_unknown.dwarf_be6cc::testFloatToHalf(0x7fffffff,0x7fff);
  anon_unknown.dwarf_be6cc::testFloatToHalf(0xffffffff,0xffff);
  anon_unknown.dwarf_be6cc::testUintToHalf(0,0);
  anon_unknown.dwarf_be6cc::testUintToHalf(1,0x3c00);
  anon_unknown.dwarf_be6cc::testUintToHalf(0x7c,0x57c0);
  anon_unknown.dwarf_be6cc::testUintToHalf(1000000,0x7c00);
  anon_unknown.dwarf_be6cc::testUintToHalf(0xffffffff,0x7c00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"conversion of image channels while reading a file ",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  comp = NO_COMPRESSION;
  do {
    if ((comp & (DWAA_COMPRESSION|B44_COMPRESSION)) != B44_COMPRESSION) {
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar21 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar21 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar21 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(int *)(pcVar12 + lVar15 * 4 + -4) = iVar16 + -10;
            *(int *)(pcVar12 + lVar15 * 4) = iVar16;
          }
          lVar33 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 2;
          auVar21._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,pcVar12,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar12;
      pcVar13 = pcVar9;
      do {
        lVar15 = 0;
        do {
          if (*(int *)(pcVar11 + lVar15 * 4) != *(int *)(pcVar13 + lVar15 * 4)) {
            pcVar12 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_3_4::UINT, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0014525b;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar13 = pcVar13 + 0x4f4;
        pcVar11 = pcVar11 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar22 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar22 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar22 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(int *)(pcVar12 + lVar15 * 4 + -4) = iVar16 + -10;
            *(int *)(pcVar12 + lVar15 * 4) = iVar16;
          }
          lVar33 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 2;
          auVar22._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_110[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar17 = (int)(TiledOutputFile *)&out;
      iVar7 = Imf_3_4::TiledOutputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
      Imf_3_4::TiledOutputFile::writeTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,pcVar12,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar17 = (int)(Slice *)&hdr;
      iVar7 = Imf_3_4::TiledInputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar17);
      Imf_3_4::TiledInputFile::readTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar12;
      pcVar13 = pcVar9;
      do {
        lVar15 = 0;
        do {
          if (*(int *)(pcVar11 + lVar15 * 4) != *(int *)(pcVar13 + lVar15 * 4)) {
            pcVar12 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_3_4::UINT, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0014523c;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar13 = pcVar13 + 0x4f4;
        pcVar11 = pcVar11 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar23 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar23 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar23 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(int *)(pcVar12 + lVar15 * 4 + -4) = iVar16 + -10;
            *(int *)(pcVar12 + lVar15 * 4) = iVar16;
          }
          lVar33 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 2;
          auVar23._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,pcVar12,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      testConversion();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar24 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar24 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar24 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(int *)(pcVar12 + lVar15 * 4 + -4) = iVar16 + -10;
            *(int *)(pcVar12 + lVar15 * 4) = iVar16;
          }
          lVar33 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 2;
          auVar24._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_110[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar17 = (int)(TiledOutputFile *)&out;
      iVar7 = Imf_3_4::TiledOutputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
      Imf_3_4::TiledOutputFile::writeTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,pcVar12,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar17 = (int)(Slice *)&hdr;
      iVar7 = Imf_3_4::TiledInputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar17);
      Imf_3_4::TiledInputFile::readTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      testConversion();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar25 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar25 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar25 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(int *)(pcVar12 + lVar15 * 4 + -4) = iVar16 + -10;
            *(int *)(pcVar12 + lVar15 * 4) = iVar16;
          }
          lVar33 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 2;
          auVar25._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,pcVar12,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar9;
      pcVar13 = pcVar12;
      do {
        lVar15 = 0;
        do {
          bVar6 = equivalent(*(float *)(pcVar13 + lVar15 * 4),(float)*(uint *)(pcVar11 + lVar15 * 4)
                             ,comp);
          if (!bVar6) {
            pcVar12 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_3_4::UINT, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
            goto LAB_0014525b;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar11 = pcVar11 + 0x4f4;
        pcVar13 = pcVar13 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar26 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar26 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar26 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(int *)(pcVar12 + lVar15 * 4 + -4) = iVar16 + -10;
            *(int *)(pcVar12 + lVar15 * 4) = iVar16;
          }
          lVar33 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 2;
          auVar26._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_110[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,UINT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar17 = (int)(TiledOutputFile *)&out;
      iVar7 = Imf_3_4::TiledOutputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
      Imf_3_4::TiledOutputFile::writeTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,pcVar12,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar17 = (int)(Slice *)&hdr;
      iVar7 = Imf_3_4::TiledInputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar17);
      Imf_3_4::TiledInputFile::readTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar9;
      pcVar13 = pcVar12;
      do {
        lVar15 = 0;
        do {
          bVar6 = equivalent(*(float *)(pcVar13 + lVar15 * 4),(float)*(uint *)(pcVar11 + lVar15 * 4)
                             ,comp);
          if (!bVar6) {
            pcVar12 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = unsigned int, OutTypeTag = Imf_3_4::UINT, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
            goto LAB_0014523c;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar11 = pcVar11 + 0x4f4;
        pcVar13 = pcVar13 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar12 = (char *)operator_new__(0x536de);
      testConversion();
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar9 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,pcVar12,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar9 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar9;
      pcVar13 = pcVar12;
      do {
        lVar15 = 0;
        do {
          if (*(int *)(pcVar11 + lVar15 * 4) !=
              (int)(long)*(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(pcVar13 + lVar15 * 2) * 4)) {
            pcVar12 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0014525b;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar13 = pcVar13 + 0x27a;
        pcVar11 = pcVar11 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar9);
      operator_delete__(pcVar12);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar12 = (char *)operator_new__(0x536de);
      testConversion();
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_110[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar9 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,pcVar12,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar17 = (int)(TiledOutputFile *)&out;
      iVar7 = Imf_3_4::TiledOutputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
      Imf_3_4::TiledOutputFile::writeTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar9 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar17 = (int)(Slice *)&hdr;
      iVar7 = Imf_3_4::TiledInputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar17);
      Imf_3_4::TiledInputFile::readTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar9;
      pcVar13 = pcVar12;
      do {
        lVar15 = 0;
        do {
          if (*(int *)(pcVar11 + lVar15 * 4) !=
              (int)(long)*(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(pcVar13 + lVar15 * 2) * 4)) {
            pcVar12 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0014523c;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar13 = pcVar13 + 0x27a;
        pcVar11 = pcVar11 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar9);
      operator_delete__(pcVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar12 = (char *)operator_new__(0x536de);
      testConversion();
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar9 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,pcVar12,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar9 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,pcVar9,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar9;
      pcVar13 = pcVar12;
      do {
        lVar15 = 0;
        do {
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar11 + lVar15 * 2) * 4);
          pfVar1 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar13 + lVar15 * 2) * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            pcVar12 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = Imath_3_2::half, InTypeTag = Imf_3_4::HALF]"
            ;
            goto LAB_0014525b;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar13 = pcVar13 + 0x27a;
        pcVar11 = pcVar11 + 0x27a;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar9);
      operator_delete__(pcVar12);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar12 = (char *)operator_new__(0x536de);
      testConversion();
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_110[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar9 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,pcVar12,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar17 = (int)(TiledOutputFile *)&out;
      iVar7 = Imf_3_4::TiledOutputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
      Imf_3_4::TiledOutputFile::writeTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar9 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,pcVar9,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar17 = (int)(Slice *)&hdr;
      iVar7 = Imf_3_4::TiledInputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar17);
      Imf_3_4::TiledInputFile::readTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar9;
      pcVar13 = pcVar12;
      do {
        lVar15 = 0;
        do {
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar11 + lVar15 * 2) * 4);
          pfVar1 = (float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar13 + lVar15 * 2) * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            pcVar12 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = Imath_3_2::half, InTypeTag = Imf_3_4::HALF]"
            ;
            goto LAB_0014523c;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar13 = pcVar13 + 0x27a;
        pcVar11 = pcVar11 + 0x27a;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar9);
      operator_delete__(pcVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar12 = (char *)operator_new__(0x536de);
      testConversion();
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar9 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,pcVar12,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar9 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar12;
      pcVar13 = pcVar9;
      do {
        lVar15 = 0;
        do {
          bVar6 = equivalent(*(float *)(pcVar13 + lVar15 * 4),
                             *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)(pcVar11 + lVar15 * 2) * 4),comp);
          if (!bVar6) {
            pcVar12 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
            goto LAB_0014525b;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar11 = pcVar11 + 0x27a;
        pcVar13 = pcVar13 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar9);
      operator_delete__(pcVar12);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar12 = (char *)operator_new__(0x536de);
      testConversion();
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_110[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar9 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,HALF,pcVar12,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar17 = (int)(TiledOutputFile *)&out;
      iVar7 = Imf_3_4::TiledOutputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
      Imf_3_4::TiledOutputFile::writeTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar9 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar17 = (int)(Slice *)&hdr;
      iVar7 = Imf_3_4::TiledInputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar17);
      Imf_3_4::TiledInputFile::readTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar12;
      pcVar13 = pcVar9;
      do {
        lVar15 = 0;
        do {
          bVar6 = equivalent(*(float *)(pcVar13 + lVar15 * 4),
                             *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)(pcVar11 + lVar15 * 2) * 4),comp);
          if (!bVar6) {
            pcVar12 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
            goto LAB_0014523c;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar11 = pcVar11 + 0x27a;
        pcVar13 = pcVar13 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar9);
      operator_delete__(pcVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar27 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar27 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar27 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(float *)(pcVar12 + lVar15 * 4 + -4) = (float)(iVar16 + -10);
            *(float *)(pcVar12 + lVar15 * 4) = (float)iVar16;
          }
          lVar33 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 2;
          auVar27._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,pcVar12,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar12;
      pcVar13 = pcVar9;
      do {
        lVar15 = 0;
        do {
          if (*(int *)(pcVar11 + lVar15 * 4) != (int)(long)*(float *)(pcVar13 + lVar15 * 4)) {
            pcVar12 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0014525b;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar13 = pcVar13 + 0x4f4;
        pcVar11 = pcVar11 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar28 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar28 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar28 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(float *)(pcVar12 + lVar15 * 4 + -4) = (float)(iVar16 + -10);
            *(float *)(pcVar12 + lVar15 * 4) = (float)iVar16;
          }
          lVar33 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 2;
          auVar28._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_110[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar17 = (int)(TiledOutputFile *)&out;
      iVar7 = Imf_3_4::TiledOutputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
      Imf_3_4::TiledOutputFile::writeTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,UINT,pcVar12,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar17 = (int)(Slice *)&hdr;
      iVar7 = Imf_3_4::TiledInputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar17);
      Imf_3_4::TiledInputFile::readTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar12;
      pcVar13 = pcVar9;
      do {
        lVar15 = 0;
        do {
          if (*(int *)(pcVar11 + lVar15 * 4) != (int)(long)*(float *)(pcVar13 + lVar15 * 4)) {
            pcVar12 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
            ;
            goto LAB_0014523c;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar13 = pcVar13 + 0x4f4;
        pcVar11 = pcVar11 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar29 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar29 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar29 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(float *)(pcVar12 + lVar15 * 4 + -4) = (float)(iVar16 + -10);
            *(float *)(pcVar12 + lVar15 * 4) = (float)iVar16;
          }
          lVar33 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 2;
          auVar29._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,pcVar12,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar12;
      pcVar13 = pcVar9;
      do {
        lVar15 = 0;
        do {
          uVar20 = *(uint *)(pcVar13 + lVar15 * 4);
          uVar19 = uVar20 & 0x7fffffff;
          uVar18 = uVar20 >> 0x10 & 0x8000;
          if (uVar19 < 0x38800000) {
            if ((0x33000000 < uVar19) &&
               (cVar4 = (char)(uVar19 >> 0x17), uVar20 = uVar20 & 0x7fffff | 0x800000,
               uVar18 = uVar18 | uVar20 >> (0x7eU - cVar4 & 0x1f),
               0x80000000 < uVar20 << (cVar4 + 0xa2U & 0x1f))) {
              uVar18 = uVar18 + 1;
            }
          }
          else if (uVar19 < 0x7f800000) {
            if (uVar19 < 0x477ff000) {
              uVar18 = uVar19 + 0x8000fff + (uint)((uVar19 >> 0xd & 1) != 0) >> 0xd | uVar18;
            }
            else {
              uVar18 = uVar18 | 0x7c00;
            }
          }
          else {
            uVar18 = uVar18 | 0x7c00;
            if (uVar19 != 0x7f800000) {
              uVar20 = uVar19 >> 0xd & 0x3ff;
              uVar18 = uVar18 | uVar20 | (uint)(uVar20 == 0);
            }
          }
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar11 + lVar15 * 2) * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)(uVar18 & 0xffff) * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            pcVar12 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = Imath_3_2::half, InTypeTag = Imf_3_4::HALF]"
            ;
            goto LAB_0014525b;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar13 = pcVar13 + 0x4f4;
        pcVar11 = pcVar11 + 0x27a;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar30 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar30 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar30 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(float *)(pcVar12 + lVar15 * 4 + -4) = (float)(iVar16 + -10);
            *(float *)(pcVar12 + lVar15 * 4) = (float)iVar16;
          }
          lVar33 = auVar30._8_8_;
          auVar30._0_8_ = auVar30._0_8_ + 2;
          auVar30._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_110[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar17 = (int)(TiledOutputFile *)&out;
      iVar7 = Imf_3_4::TiledOutputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
      Imf_3_4::TiledOutputFile::writeTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0x536de);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,HALF,pcVar12,2,0x27a,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar17 = (int)(Slice *)&hdr;
      iVar7 = Imf_3_4::TiledInputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar17);
      Imf_3_4::TiledInputFile::readTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar12;
      pcVar13 = pcVar9;
      do {
        lVar15 = 0;
        do {
          uVar20 = *(uint *)(pcVar13 + lVar15 * 4);
          uVar19 = uVar20 & 0x7fffffff;
          uVar18 = uVar20 >> 0x10 & 0x8000;
          if (uVar19 < 0x38800000) {
            if ((0x33000000 < uVar19) &&
               (cVar4 = (char)(uVar19 >> 0x17), uVar20 = uVar20 & 0x7fffff | 0x800000,
               uVar18 = uVar18 | uVar20 >> (0x7eU - cVar4 & 0x1f),
               0x80000000 < uVar20 << (cVar4 + 0xa2U & 0x1f))) {
              uVar18 = uVar18 + 1;
            }
          }
          else if (uVar19 < 0x7f800000) {
            if (uVar19 < 0x477ff000) {
              uVar18 = uVar19 + 0x8000fff + (uint)((uVar19 >> 0xd & 1) != 0) >> 0xd | uVar18;
            }
            else {
              uVar18 = uVar18 | 0x7c00;
            }
          }
          else {
            uVar18 = uVar18 | 0x7c00;
            if (uVar19 != 0x7f800000) {
              uVar20 = uVar19 >> 0xd & 0x3ff;
              uVar18 = uVar18 | uVar20 | (uint)(uVar20 == 0);
            }
          }
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar11 + lVar15 * 2) * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)(uVar18 & 0xffff) * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            pcVar12 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = Imath_3_2::half, InTypeTag = Imf_3_4::HALF]"
            ;
            goto LAB_0014523c;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar13 = pcVar13 + 0x4f4;
        pcVar11 = pcVar11 + 0x27a;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      pcVar3 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scan lines, compression ",0x18);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar31 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar31 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar31 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(float *)(pcVar12 + lVar15 * 4 + -4) = (float)(iVar16 + -10);
            *(float *)(pcVar12 + lVar15 * 4) = (float)iVar16;
          }
          lVar33 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 2;
          auVar31._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::OutputFile::OutputFile(&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
      Imf_3_4::OutputFile::writePixels((int)&out);
      Imf_3_4::OutputFile::~OutputFile(&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,pcVar12,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&hdr);
      Imf_3_4::InputFile::readPixels((int)(Slice *)&hdr,0);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar9;
      pcVar13 = pcVar12;
      do {
        lVar15 = 0;
        do {
          bVar6 = equivalent(*(float *)(pcVar13 + lVar15 * 4),*(float *)(pcVar11 + lVar15 * 4),comp)
          ;
          if (!bVar6) {
            pcVar12 = 
            "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
LAB_0014525b:
            __assert_fail("isEquivalent ( inPixels[y][x], InType (outPixels[y][x]), compression)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                          ,0xd4,pcVar12);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar11 = pcVar11 + 0x4f4;
        pcVar13 = pcVar13 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      _Var5 = __str._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tiles, compression ",0x13);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,comp);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"output type ",0xc);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"input type ",0xb);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n    ",6);
      std::ostream::flush();
      pcVar9 = (char *)operator_new__(0xa6dbc);
      iVar7 = 10;
      lVar14 = 0;
      pcVar12 = pcVar9;
      do {
        lVar15 = 1;
        auVar32 = _DAT_001b7b00;
        iVar16 = iVar7;
        do {
          if (SUB164(auVar32 ^ _DAT_001b7b10,4) == -0x80000000 &&
              SUB164(auVar32 ^ _DAT_001b7b10,0) < -0x7ffffec3) {
            *(float *)(pcVar12 + lVar15 * 4 + -4) = (float)(iVar16 + -10);
            *(float *)(pcVar12 + lVar15 * 4) = (float)iVar16;
          }
          lVar33 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 2;
          auVar32._8_8_ = lVar33 + 2;
          iVar16 = iVar16 + 0x14;
          lVar15 = lVar15 + 2;
        } while (lVar15 != 0x13f);
        lVar14 = lVar14 + 1;
        iVar7 = iVar7 + 1;
        pcVar12 = pcVar12 + 0x4f4;
      } while (lVar14 != 0x21b);
      _out = 0;
      Imf_3_4::Header::Header(&hdr,0x13d,0x21b,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      _out = 0x4300000043;
      auStack_110[0] = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
      pCVar10 = (Compression *)Imf_3_4::Header::compression();
      *pCVar10 = comp;
      pcVar12 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar12,(Channel *)0x1c19ae);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,pcVar9,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c19ae);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
      std::ostream::flush();
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile((TiledOutputFile *)&out,_Var5._M_p,&hdr,iVar7);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
      iVar17 = (int)(TiledOutputFile *)&out;
      iVar7 = Imf_3_4::TiledOutputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledOutputFile::numYTiles(iVar17);
      Imf_3_4::TiledOutputFile::writeTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&out);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&fb);
      Imf_3_4::Header::~Header(&hdr);
      pcVar12 = (char *)operator_new__(0xa6dbc);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      std::ostream::flush();
      auStack_110[0] = auStack_110[0] & 0xffffffff00000000;
      auStack_110[1] = 0;
      local_100 = auStack_110;
      local_f0 = 0;
      local_f8 = local_100;
      Imf_3_4::Slice::Slice((Slice *)&hdr,FLOAT,pcVar12,4,0x4f4,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&out,(Slice *)0x1c19ae);
      iVar7 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&hdr,_Var5._M_p,iVar7);
      Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&hdr);
      iVar17 = (int)(Slice *)&hdr;
      iVar7 = Imf_3_4::TiledInputFile::numXTiles(iVar17);
      iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar17);
      Imf_3_4::TiledInputFile::readTiles(iVar17,0,iVar7 + -1,0,iVar16 + -1);
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
      std::ostream::flush();
      lVar14 = 0;
      pcVar11 = pcVar9;
      pcVar13 = pcVar12;
      do {
        lVar15 = 0;
        do {
          bVar6 = equivalent(*(float *)(pcVar13 + lVar15 * 4),*(float *)(pcVar11 + lVar15 * 4),comp)
          ;
          if (!bVar6) {
            pcVar12 = 
            "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = float, OutTypeTag = Imf_3_4::FLOAT, InType = float, InTypeTag = Imf_3_4::FLOAT]"
            ;
LAB_0014523c:
            __assert_fail("isEquivalent ( inPixels[y][x], InType (outPixels[y][x]), compression)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                          ,0x129,pcVar12);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x13d);
        lVar14 = lVar14 + 1;
        pcVar11 = pcVar11 + 0x4f4;
        pcVar13 = pcVar13 + 0x4f4;
      } while (lVar14 != 0x21b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      remove(_Var5._M_p);
      operator_delete__(pcVar12);
      operator_delete__(pcVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
    }
    comp = comp + RLE_COMPRESSION;
    if (comp == NUM_COMPRESSION_METHODS) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void
testConversion (const std::string& tempDir)
{
    try
    {
        cout << "Testing conversion between pixel data types" << endl;

        cout << "individual numbers" << endl;

        testNumbers ();

        cout << "conversion of image channels while reading a file " << endl;

        for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
        {
            if (comp == B44_COMPRESSION || comp == B44A_COMPRESSION)
            {
                continue;
            }

            testImageChannel<unsigned int, IMF::UINT, unsigned int, IMF::UINT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<unsigned int, IMF::UINT, half, IMF::HALF> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<unsigned int, IMF::UINT, float, IMF::FLOAT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<half, IMF::HALF, unsigned int, IMF::UINT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<half, IMF::HALF, half, IMF::HALF> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<half, IMF::HALF, float, IMF::FLOAT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<float, IMF::FLOAT, unsigned int, IMF::UINT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<float, IMF::FLOAT, half, IMF::HALF> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));

            testImageChannel<float, IMF::FLOAT, float, IMF::FLOAT> (
                tempDir + "imf_test_conv.exr", 317, 539, Compression (comp));
        }
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}